

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

ProtoWriter * __thiscall
google::protobuf::util::converter::ProtoWriter::RenderDataPiece
          (ProtoWriter *this,StringPiece name,DataPiece *data)

{
  string *psVar1;
  ProtoElement *pPVar2;
  undefined8 uVar3;
  bool bVar4;
  Field *field;
  Type *type;
  LocationTrackerInterface *pLVar5;
  char *local_d8;
  undefined8 local_d0;
  AlphaNum local_a8;
  undefined1 local_78 [8];
  Status status;
  size_t local_48;
  undefined1 local_40 [16];
  
  Status::Status((Status *)local_78);
  if (this->invalid_depth_ < 1) {
    field = Lookup(this,name);
    if (field != (Field *)0x0) {
      bVar4 = ValidOneof(this,field,name);
      if (bVar4) {
        type = LookupType(this,field);
        if (type == (Type *)0x0) {
          local_d8 = "Missing descriptor for field: ";
          local_d0 = 0x1e;
          psVar1 = (field->type_url_).ptr_;
          local_a8.piece_data_ = (psVar1->_M_dataplus)._M_p;
          local_a8.piece_size_ = psVar1->_M_string_length;
          StrCat_abi_cxx11_((string *)((long)&status.error_message_.field_2 + 8),
                            (protobuf *)&local_d8,&local_a8,(AlphaNum *)local_a8.piece_data_);
          uVar3 = status.error_message_.field_2._8_8_;
          if ((long)local_48 < 0) {
            StringPiece::LogFatalSizeTooBig(local_48,"size_t to int conversion");
          }
          pPVar2 = (this->element_)._M_t.
                   super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
                   .
                   super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
                   ._M_head_impl;
          if (pPVar2 == (ProtoElement *)0x0) {
            pLVar5 = (this->tracker_)._M_t.
                     super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                     .
                     super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                     ._M_head_impl;
          }
          else {
            pLVar5 = &pPVar2->super_LocationTrackerInterface;
          }
          (*this->listener_->_vptr_ErrorListener[2])
                    (this->listener_,pLVar5,name.ptr_,name.length_,uVar3,local_48);
          if ((undefined1 *)status.error_message_.field_2._8_8_ != local_40) {
            operator_delete((void *)status.error_message_.field_2._8_8_);
          }
        }
        else {
          RenderPrimitiveField(this,field,type,data);
        }
      }
    }
  }
  if ((size_type *)status._0_8_ != &status.error_message_._M_string_length) {
    operator_delete((void *)status._0_8_);
  }
  return this;
}

Assistant:

ProtoWriter* ProtoWriter::RenderDataPiece(
    StringPiece name, const DataPiece& data) {
  Status status;
  if (invalid_depth_ > 0) return this;

  const google::protobuf::Field* field = Lookup(name);

  if (field == nullptr) return this;

  if (!ValidOneof(*field, name)) return this;

  const google::protobuf::Type* type = LookupType(field);
  if (type == nullptr) {
    InvalidName(name, StrCat("Missing descriptor for field: ",
                                   field->type_url()));
    return this;
  }

  return RenderPrimitiveField(*field, *type, data);
}